

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void rethook(lua_State *L,CallInfo *ci,int nres)

{
  StkId pSVar1;
  CallInfo *pCVar2;
  StkId pSVar3;
  long lVar4;
  
  if ((L->hookmask & 2U) != 0) {
    pSVar1 = (L->top).p;
    if (((ci->callstatus & 0x8000) == 0) &&
       (lVar4 = *(long *)((((ci->func).p)->val).value_.f + 0x18), (*(byte *)(lVar4 + 0xb) & 1) != 0)
       ) {
      lVar4 = (long)(int)((uint)*(byte *)(lVar4 + 10) + (ci->u).l.nextraargs + 1);
    }
    else {
      lVar4 = 0;
    }
    pSVar3 = (ci->func).p + lVar4;
    (ci->func).offset = (ptrdiff_t)pSVar3;
    luaD_hook(L,1,-1,(int)((ulong)((long)pSVar1 + ((long)nres * -0x10 - (long)pSVar3)) >> 4),nres);
    (ci->func).p = (ci->func).p + -lVar4;
  }
  pCVar2 = ci->previous;
  if ((pCVar2->callstatus & 0x8000) == 0) {
    L->oldpc = (int)((ulong)((long)(pCVar2->u).l.savedpc -
                            *(long *)(*(long *)((((pCVar2->func).p)->val).value_.f + 0x18) + 0x40))
                    >> 2) + -1;
  }
  return;
}

Assistant:

static void rethook (lua_State *L, CallInfo *ci, int nres) {
  if (L->hookmask & LUA_MASKRET) {  /* is return hook on? */
    StkId firstres = L->top.p - nres;  /* index of first result */
    int delta = 0;  /* correction for vararg functions */
    int ftransfer;
    if (isLua(ci)) {
      Proto *p = ci_func(ci)->p;
      if (p->flag & PF_ISVARARG)
        delta = ci->u.l.nextraargs + p->numparams + 1;
    }
    ci->func.p += delta;  /* if vararg, back to virtual 'func' */
    ftransfer = cast_int(firstres - ci->func.p);
    luaD_hook(L, LUA_HOOKRET, -1, ftransfer, nres);  /* call it */
    ci->func.p -= delta;
  }
  if (isLua(ci = ci->previous))
    L->oldpc = pcRel(ci->u.l.savedpc, ci_func(ci)->p);  /* set 'oldpc' */
}